

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.cpp
# Opt level: O3

int __thiscall ncnn::Squeeze::forward(Squeeze *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  void *pvVar2;
  int *piVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  long lVar14;
  int iVar15;
  int _h;
  int _h_00;
  bool bVar16;
  bool bVar17;
  Mat local_a0;
  int local_54;
  int local_50;
  int local_4c;
  Option *local_48;
  Mat *local_40;
  Mat *local_38;
  
  uVar1 = bottom_blob->dims;
  iVar10 = bottom_blob->w;
  _h = bottom_blob->h;
  _h_00 = bottom_blob->c;
  pvVar2 = (this->axes).data;
  if ((pvVar2 == (void *)0x0) || ((long)(this->axes).c * (this->axes).cstep == 0)) {
    bVar16 = this->squeeze_w != 0 && iVar10 == 1;
    bVar12 = this->squeeze_h != 0 && _h == 1;
    bVar13 = this->squeeze_c != 0 && _h_00 == 1;
  }
  else {
    lVar11 = (long)(this->axes).w;
    if (lVar11 < 1) {
      bVar16 = false;
      bVar12 = false;
      bVar13 = false;
    }
    else {
      bVar17 = iVar10 == 1;
      lVar14 = 0;
      bVar12 = false;
      bVar16 = false;
      bVar7 = false;
      do {
        iVar15 = *(int *)((long)pvVar2 + lVar14 * 4);
        iVar15 = (iVar15 >> 0x1f & uVar1) + iVar15;
        bVar4 = bVar16;
        bVar6 = bVar12;
        bVar13 = bVar7;
        if (iVar15 == 0) {
          bVar4 = bVar17;
          bVar6 = _h == 1;
          bVar13 = _h_00 == 1;
        }
        if (uVar1 != 2) {
          bVar6 = bVar12;
        }
        if (uVar1 != 1) {
          bVar4 = bVar16;
        }
        bVar5 = bVar4;
        bVar12 = bVar6;
        if (iVar15 == 1) {
          bVar5 = bVar17;
          bVar12 = _h == 1;
        }
        if (uVar1 != 2) {
          bVar5 = bVar4;
        }
        bVar16 = bVar5;
        if (iVar15 == 2) {
          bVar16 = bVar17;
        }
        if (uVar1 != 3) {
          bVar16 = bVar5;
          bVar12 = bVar6;
          bVar13 = bVar7;
        }
        lVar14 = lVar14 + 1;
        local_54 = _h_00;
        local_50 = iVar10;
        local_4c = _h;
        local_48 = opt;
        local_40 = bottom_blob;
        local_38 = top_blob;
        bVar7 = bVar13;
      } while (lVar11 != lVar14);
    }
  }
  if (top_blob != bottom_blob) {
    piVar3 = bottom_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = top_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data != (void *)0x0) {
            local_54 = _h_00;
            local_50 = iVar10;
            local_4c = _h;
            local_48 = opt;
            free(top_blob->data);
            opt = local_48;
            _h = local_4c;
            _h_00 = local_54;
            iVar10 = local_50;
          }
        }
        else {
          local_54 = _h_00;
          local_50 = iVar10;
          local_4c = _h;
          local_48 = opt;
          (*top_blob->allocator->_vptr_Allocator[3])();
          opt = local_48;
          _h = local_4c;
          _h_00 = local_54;
          iVar10 = local_50;
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    top_blob->c = 0;
    piVar3 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar3;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar15 = bottom_blob->w;
    iVar8 = bottom_blob->h;
    iVar9 = bottom_blob->d;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar15;
    top_blob->h = iVar8;
    top_blob->d = iVar9;
    top_blob->c = bottom_blob->c;
    top_blob->cstep = bottom_blob->cstep;
  }
  if (uVar1 == 3) {
    if (bVar16) {
      if (bVar12) {
        if (bVar13) {
          Mat::reshape(&local_a0,bottom_blob,1,opt->blob_allocator);
          if (&local_a0 != top_blob) {
            if (local_a0.refcount != (int *)0x0) {
              LOCK();
              *local_a0.refcount = *local_a0.refcount + 1;
              UNLOCK();
            }
            piVar3 = top_blob->refcount;
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->data = local_a0.data;
            top_blob->refcount = local_a0.refcount;
            top_blob->elemsize = local_a0.elemsize;
            top_blob->elempack = local_a0.elempack;
            top_blob->allocator = local_a0.allocator;
            top_blob->dims = local_a0.dims;
            top_blob->w = local_a0.w;
            top_blob->h = local_a0.h;
            top_blob->d = local_a0.d;
            top_blob->c = local_a0.c;
            top_blob->cstep = local_a0.cstep;
          }
          if (local_a0.refcount == (int *)0x0) goto LAB_002a5e6d;
          LOCK();
          *local_a0.refcount = *local_a0.refcount + -1;
          UNLOCK();
          if (*local_a0.refcount != 0) goto LAB_002a5e6d;
          if (local_a0.allocator != (Allocator *)0x0) {
            (*(local_a0.allocator)->_vptr_Allocator[3])();
            goto LAB_002a5e6d;
          }
        }
        else {
          Mat::reshape(&local_a0,bottom_blob,_h_00,opt->blob_allocator);
          if (&local_a0 != top_blob) {
            if (local_a0.refcount != (int *)0x0) {
              LOCK();
              *local_a0.refcount = *local_a0.refcount + 1;
              UNLOCK();
            }
            piVar3 = top_blob->refcount;
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->data = local_a0.data;
            top_blob->refcount = local_a0.refcount;
            top_blob->elemsize = local_a0.elemsize;
            top_blob->elempack = local_a0.elempack;
            top_blob->allocator = local_a0.allocator;
            top_blob->dims = local_a0.dims;
            top_blob->w = local_a0.w;
            top_blob->h = local_a0.h;
            top_blob->d = local_a0.d;
            top_blob->c = local_a0.c;
            top_blob->cstep = local_a0.cstep;
          }
          if (local_a0.refcount == (int *)0x0) goto LAB_002a5e6d;
          LOCK();
          *local_a0.refcount = *local_a0.refcount + -1;
          UNLOCK();
          if (*local_a0.refcount != 0) goto LAB_002a5e6d;
          if (local_a0.allocator != (Allocator *)0x0) {
            (*(local_a0.allocator)->_vptr_Allocator[3])();
            goto LAB_002a5e6d;
          }
        }
      }
      else if (bVar13) {
        Mat::reshape(&local_a0,bottom_blob,_h,opt->blob_allocator);
        if (&local_a0 != top_blob) {
          if (local_a0.refcount != (int *)0x0) {
            LOCK();
            *local_a0.refcount = *local_a0.refcount + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_a0.data;
          top_blob->refcount = local_a0.refcount;
          top_blob->elemsize = local_a0.elemsize;
          top_blob->elempack = local_a0.elempack;
          top_blob->allocator = local_a0.allocator;
          top_blob->dims = local_a0.dims;
          top_blob->w = local_a0.w;
          top_blob->h = local_a0.h;
          top_blob->d = local_a0.d;
          top_blob->c = local_a0.c;
          top_blob->cstep = local_a0.cstep;
        }
        if (local_a0.refcount == (int *)0x0) goto LAB_002a5e6d;
        LOCK();
        *local_a0.refcount = *local_a0.refcount + -1;
        UNLOCK();
        if (*local_a0.refcount != 0) goto LAB_002a5e6d;
        if (local_a0.allocator != (Allocator *)0x0) {
          (*(local_a0.allocator)->_vptr_Allocator[3])();
          goto LAB_002a5e6d;
        }
      }
      else {
        Mat::reshape(&local_a0,bottom_blob,_h,_h_00,opt->blob_allocator);
        if (&local_a0 != top_blob) {
          if (local_a0.refcount != (int *)0x0) {
            LOCK();
            *local_a0.refcount = *local_a0.refcount + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_a0.data;
          top_blob->refcount = local_a0.refcount;
          top_blob->elemsize = local_a0.elemsize;
          top_blob->elempack = local_a0.elempack;
          top_blob->allocator = local_a0.allocator;
          top_blob->dims = local_a0.dims;
          top_blob->w = local_a0.w;
          top_blob->h = local_a0.h;
          top_blob->d = local_a0.d;
          top_blob->c = local_a0.c;
          top_blob->cstep = local_a0.cstep;
        }
        if (local_a0.refcount == (int *)0x0) goto LAB_002a5e6d;
        LOCK();
        *local_a0.refcount = *local_a0.refcount + -1;
        UNLOCK();
        if (*local_a0.refcount != 0) goto LAB_002a5e6d;
        if (local_a0.allocator != (Allocator *)0x0) {
          (*(local_a0.allocator)->_vptr_Allocator[3])();
          goto LAB_002a5e6d;
        }
      }
    }
    else if (bVar12) {
      if (bVar13) {
        Mat::reshape(&local_a0,bottom_blob,iVar10,opt->blob_allocator);
        if (&local_a0 != top_blob) {
          if (local_a0.refcount != (int *)0x0) {
            LOCK();
            *local_a0.refcount = *local_a0.refcount + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_a0.data;
          top_blob->refcount = local_a0.refcount;
          top_blob->elemsize = local_a0.elemsize;
          top_blob->elempack = local_a0.elempack;
          top_blob->allocator = local_a0.allocator;
          top_blob->dims = local_a0.dims;
          top_blob->w = local_a0.w;
          top_blob->h = local_a0.h;
          top_blob->d = local_a0.d;
          top_blob->c = local_a0.c;
          top_blob->cstep = local_a0.cstep;
        }
        if (local_a0.refcount == (int *)0x0) goto LAB_002a5e6d;
        LOCK();
        *local_a0.refcount = *local_a0.refcount + -1;
        UNLOCK();
        if (*local_a0.refcount != 0) goto LAB_002a5e6d;
        if (local_a0.allocator != (Allocator *)0x0) {
          (*(local_a0.allocator)->_vptr_Allocator[3])();
          goto LAB_002a5e6d;
        }
      }
      else {
        Mat::reshape(&local_a0,bottom_blob,iVar10,_h_00,opt->blob_allocator);
        if (&local_a0 != top_blob) {
          if (local_a0.refcount != (int *)0x0) {
            LOCK();
            *local_a0.refcount = *local_a0.refcount + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_a0.data;
          top_blob->refcount = local_a0.refcount;
          top_blob->elemsize = local_a0.elemsize;
          top_blob->elempack = local_a0.elempack;
          top_blob->allocator = local_a0.allocator;
          top_blob->dims = local_a0.dims;
          top_blob->w = local_a0.w;
          top_blob->h = local_a0.h;
          top_blob->d = local_a0.d;
          top_blob->c = local_a0.c;
          top_blob->cstep = local_a0.cstep;
        }
        if (local_a0.refcount == (int *)0x0) goto LAB_002a5e6d;
        LOCK();
        *local_a0.refcount = *local_a0.refcount + -1;
        UNLOCK();
        if (*local_a0.refcount != 0) goto LAB_002a5e6d;
        if (local_a0.allocator != (Allocator *)0x0) {
          (*(local_a0.allocator)->_vptr_Allocator[3])();
          goto LAB_002a5e6d;
        }
      }
    }
    else {
      if (!bVar13) goto LAB_002a5e6d;
      Mat::reshape(&local_a0,bottom_blob,iVar10,_h,opt->blob_allocator);
      if (&local_a0 != top_blob) {
        if (local_a0.refcount != (int *)0x0) {
          LOCK();
          *local_a0.refcount = *local_a0.refcount + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_a0.data;
        top_blob->refcount = local_a0.refcount;
        top_blob->elemsize = local_a0.elemsize;
        top_blob->elempack = local_a0.elempack;
        top_blob->allocator = local_a0.allocator;
        top_blob->dims = local_a0.dims;
        top_blob->w = local_a0.w;
        top_blob->h = local_a0.h;
        top_blob->d = local_a0.d;
        top_blob->c = local_a0.c;
        top_blob->cstep = local_a0.cstep;
      }
      if (local_a0.refcount == (int *)0x0) goto LAB_002a5e6d;
      LOCK();
      *local_a0.refcount = *local_a0.refcount + -1;
      UNLOCK();
      if (*local_a0.refcount != 0) goto LAB_002a5e6d;
      if (local_a0.allocator != (Allocator *)0x0) {
        (*(local_a0.allocator)->_vptr_Allocator[3])();
        goto LAB_002a5e6d;
      }
    }
  }
  else if (uVar1 == 2) {
    if (bVar16) {
      if (bVar12) {
        Mat::reshape(&local_a0,bottom_blob,1,opt->blob_allocator);
        if (&local_a0 != top_blob) {
          if (local_a0.refcount != (int *)0x0) {
            LOCK();
            *local_a0.refcount = *local_a0.refcount + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_a0.data;
          top_blob->refcount = local_a0.refcount;
          top_blob->elemsize = local_a0.elemsize;
          top_blob->elempack = local_a0.elempack;
          top_blob->allocator = local_a0.allocator;
          top_blob->dims = local_a0.dims;
          top_blob->w = local_a0.w;
          top_blob->h = local_a0.h;
          top_blob->d = local_a0.d;
          top_blob->c = local_a0.c;
          top_blob->cstep = local_a0.cstep;
        }
        if (local_a0.refcount == (int *)0x0) goto LAB_002a5e6d;
        LOCK();
        *local_a0.refcount = *local_a0.refcount + -1;
        UNLOCK();
        if (*local_a0.refcount != 0) goto LAB_002a5e6d;
        if (local_a0.allocator != (Allocator *)0x0) {
          (*(local_a0.allocator)->_vptr_Allocator[3])();
          goto LAB_002a5e6d;
        }
      }
      else {
        Mat::reshape(&local_a0,bottom_blob,_h,opt->blob_allocator);
        if (&local_a0 != top_blob) {
          if (local_a0.refcount != (int *)0x0) {
            LOCK();
            *local_a0.refcount = *local_a0.refcount + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = local_a0.data;
          top_blob->refcount = local_a0.refcount;
          top_blob->elemsize = local_a0.elemsize;
          top_blob->elempack = local_a0.elempack;
          top_blob->allocator = local_a0.allocator;
          top_blob->dims = local_a0.dims;
          top_blob->w = local_a0.w;
          top_blob->h = local_a0.h;
          top_blob->d = local_a0.d;
          top_blob->c = local_a0.c;
          top_blob->cstep = local_a0.cstep;
        }
        if (local_a0.refcount == (int *)0x0) goto LAB_002a5e6d;
        LOCK();
        *local_a0.refcount = *local_a0.refcount + -1;
        UNLOCK();
        if (*local_a0.refcount != 0) goto LAB_002a5e6d;
        if (local_a0.allocator != (Allocator *)0x0) {
          (*(local_a0.allocator)->_vptr_Allocator[3])();
          goto LAB_002a5e6d;
        }
      }
    }
    else {
      if (!bVar12) goto LAB_002a5e6d;
      Mat::reshape(&local_a0,bottom_blob,iVar10,opt->blob_allocator);
      if (&local_a0 != top_blob) {
        if (local_a0.refcount != (int *)0x0) {
          LOCK();
          *local_a0.refcount = *local_a0.refcount + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_a0.data;
        top_blob->refcount = local_a0.refcount;
        top_blob->elemsize = local_a0.elemsize;
        top_blob->elempack = local_a0.elempack;
        top_blob->allocator = local_a0.allocator;
        top_blob->dims = local_a0.dims;
        top_blob->w = local_a0.w;
        top_blob->h = local_a0.h;
        top_blob->d = local_a0.d;
        top_blob->c = local_a0.c;
        top_blob->cstep = local_a0.cstep;
      }
      if (local_a0.refcount == (int *)0x0) goto LAB_002a5e6d;
      LOCK();
      *local_a0.refcount = *local_a0.refcount + -1;
      UNLOCK();
      if (*local_a0.refcount != 0) goto LAB_002a5e6d;
      if (local_a0.allocator != (Allocator *)0x0) {
        (*(local_a0.allocator)->_vptr_Allocator[3])();
        goto LAB_002a5e6d;
      }
    }
  }
  else {
    if ((uVar1 != 1) || (!bVar16)) goto LAB_002a5e6d;
    Mat::reshape(&local_a0,bottom_blob,1,opt->blob_allocator);
    if (&local_a0 != top_blob) {
      if (local_a0.refcount != (int *)0x0) {
        LOCK();
        *local_a0.refcount = *local_a0.refcount + 1;
        UNLOCK();
      }
      piVar3 = top_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->data = local_a0.data;
      top_blob->refcount = local_a0.refcount;
      top_blob->elemsize = local_a0.elemsize;
      top_blob->elempack = local_a0.elempack;
      top_blob->allocator = local_a0.allocator;
      top_blob->dims = local_a0.dims;
      top_blob->w = local_a0.w;
      top_blob->h = local_a0.h;
      top_blob->d = local_a0.d;
      top_blob->c = local_a0.c;
      top_blob->cstep = local_a0.cstep;
    }
    if (local_a0.refcount == (int *)0x0) goto LAB_002a5e6d;
    LOCK();
    *local_a0.refcount = *local_a0.refcount + -1;
    UNLOCK();
    if (*local_a0.refcount != 0) goto LAB_002a5e6d;
    if (local_a0.allocator != (Allocator *)0x0) {
      (*(local_a0.allocator)->_vptr_Allocator[3])();
      goto LAB_002a5e6d;
    }
  }
  if (local_a0.data != (void *)0x0) {
    free(local_a0.data);
  }
LAB_002a5e6d:
  if ((top_blob->data == (void *)0x0) || (iVar10 = 0, (long)top_blob->c * top_blob->cstep == 0)) {
    iVar10 = -100;
  }
  return iVar10;
}

Assistant:

int Squeeze::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    bool _squeeze_w = false;
    bool _squeeze_h = false;
    bool _squeeze_c = false;

    if (axes.empty())
    {
        _squeeze_w = w == 1 && squeeze_w;
        _squeeze_h = h == 1 && squeeze_h;
        _squeeze_c = channels == 1 && squeeze_c;
    }
    else
    {
        const int* axes_ptr = axes;
        for (int i = 0; i < axes.w; i++)
        {
            int axis = axes_ptr[i];
            if (axis < 0)
                axis = dims + axis;

            if (dims == 1 && axis == 0)
            {
                _squeeze_w = w == 1;
            }
            if (dims == 2 && axis == 0)
            {
                _squeeze_h = h == 1;
            }
            if (dims == 2 && axis == 1)
            {
                _squeeze_w = w == 1;
            }
            if (dims == 3 && axis == 0)
            {
                _squeeze_c = channels == 1;
            }
            if (dims == 3 && axis == 1)
            {
                _squeeze_h = h == 1;
            }
            if (dims == 3 && axis == 2)
            {
                _squeeze_w = w == 1;
            }
        }
    }

    top_blob = bottom_blob;

    if (dims == 1)
    {
        if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
    }

    if (dims == 2)
    {
        if (_squeeze_w && _squeeze_h)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
        else if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(h, opt.blob_allocator);
        }
        else if (_squeeze_h)
        {
            top_blob = bottom_blob.reshape(w, opt.blob_allocator);
        }
    }

    if (dims == 3)
    {
        if (_squeeze_w && _squeeze_h && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_h)
        {
            top_blob = bottom_blob.reshape(channels, opt.blob_allocator);
        }
        else if (_squeeze_h && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(h, opt.blob_allocator);
        }
        else if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(h, channels, opt.blob_allocator);
        }
        else if (_squeeze_h)
        {
            top_blob = bottom_blob.reshape(w, channels, opt.blob_allocator);
        }
        else if (_squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, h, opt.blob_allocator);
        }
    }

    if (top_blob.empty())
        return -100;

    return 0;
}